

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  char *pcVar1;
  undefined8 local_28;
  long local_20;
  StringPtr local_18;
  
  local_28 = *param_2;
  local_20 = param_2[1] + -1;
  pcVar1 = (char *)((long *)param_2[2])[1];
  local_18.content.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_18.content.ptr = *(char **)param_2[2];
  }
  local_18.content.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_18.content.size_ = (size_t)(pcVar1 + -1);
  }
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)(param_2 + 3),&local_18,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}